

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O1

bool __thiscall
QCommandLineParserPrivate::parseOptionValue
          (QCommandLineParserPrivate *this,QString *optionName,QString *argument,
          const_iterator *argumentIterator,const_iterator argsEnd)

{
  int iVar1;
  byte bVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *data;
  QString *pQVar5;
  char16_t *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  Flags FVar9;
  qsizetype qVar10;
  ulong uVar11;
  uchar *puVar12;
  QCommandLineOption *this_00;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  const_iterator cVar13;
  mapped_type optionOffset;
  QString local_90;
  QString local_78;
  long local_60;
  TryEmplaceResult local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar13 = QHash<QString,_long_long>::constFindImpl<QString>(&this->nameHash,optionName);
  if (cVar13.i.d != (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 || cVar13.i.bucket != 0) {
    qVar10 = QString::indexOf(argument,(QChar)0x3d,0,CaseSensitive);
    pSVar3 = (cVar13.i.d)->spans;
    uVar11 = cVar13.i.bucket >> 7;
    local_60 = *(long *)(pSVar3[uVar11].entries
                         [pSVar3[uVar11].offsets[(uint)cVar13.i.bucket & 0x7f]].storage.data + 0x18)
    ;
    this_00 = (this->commandLineOptionList).d.ptr + local_60;
    FVar9 = QCommandLineOption::flags(this_00);
    if (((uint)FVar9.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
               super_QFlagsStorage<QCommandLineOption::Flag>.i & 4) != 0) {
      argumentIterator->i = (QString *)argsEnd;
LAB_003e19a1:
      bVar8 = SUB41(((uint)FVar9.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                           super_QFlagsStorage<QCommandLineOption::Flag>.i & 4) >> 2,0);
      goto LAB_003e1c14;
    }
    QCommandLineOption::valueName((QString *)&local_58,this_00);
    uVar7 = local_58._16_8_;
    if (local_58.iterator.i.d != (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
      LOCK();
      ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58.iterator.i.d,2,0x10);
      }
    }
    if (uVar7 == 0) {
      if (qVar10 != -1) {
        QCoreApplication::translate
                  (&local_78,"QCommandLineParser","Unexpected value after \'%1\'.",(char *)0x0,-1);
        QString::left(&local_90,argument,qVar10);
        a.m_size = local_90.d.size | 0x8000000000000000;
        a.field_0.m_data_utf16 = local_90.d.ptr;
        QString::arg_impl((QString *)&local_58,&local_78,a,0,(QChar)0x20);
        data = (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)(this->errorText).d.d;
        pcVar6 = (this->errorText).d.ptr;
        (this->errorText).d.d = (Data *)local_58.iterator.i.d;
        (this->errorText).d.ptr = (char16_t *)local_58.iterator.i.bucket;
        qVar10 = (this->errorText).d.size;
        (this->errorText).d.size = local_58._16_8_;
        local_58.iterator.i.d = data;
        local_58.iterator.i.bucket = (size_t)pcVar6;
        local_58._16_8_ = qVar10;
        if (data != (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
          LOCK();
          (data->ref).atomic._q_value.super___atomic_base<int>._M_i =
               (data->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)data,2,0x10);
          }
        }
        if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_90.d.d !=
            (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          iVar1 = ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
joined_r0x003e1b84:
          if (iVar1 == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
          }
        }
LAB_003e1cce:
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_003e19a1;
      }
    }
    else if (qVar10 == -1) {
      pQVar5 = argumentIterator->i;
      argumentIterator->i = pQVar5 + 1;
      if (pQVar5 + 1 == argsEnd.i) {
        QCoreApplication::translate
                  (&local_78,"QCommandLineParser","Missing value after \'%1\'.",(char *)0x0,-1);
        a_00.m_size = (argument->d).size | 0x8000000000000000;
        a_00.field_0.m_data_utf16 = (argument->d).ptr;
        QString::arg_impl((QString *)&local_58,&local_78,a_00,0,(QChar)0x20);
        local_90.d.d = (this->errorText).d.d;
        pcVar6 = (this->errorText).d.ptr;
        (this->errorText).d.d = (Data *)local_58.iterator.i.d;
        (this->errorText).d.ptr = (char16_t *)local_58.iterator.i.bucket;
        qVar10 = (this->errorText).d.size;
        (this->errorText).d.size = local_58._16_8_;
        local_58.iterator.i.d =
             (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_90.d.d;
        local_58.iterator.i.bucket = (size_t)pcVar6;
        local_58._16_8_ = qVar10;
        if ((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_90.d.d !=
            (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
          LOCK();
          (((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_90.d.d)->ref).atomic.
          _q_value.super___atomic_base<int>._M_i =
               (((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_90.d.d)->ref).atomic
               ._q_value.super___atomic_base<int>._M_i + -1;
          iVar1 = (((Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)local_90.d.d)->ref).
                  atomic._q_value.super___atomic_base<int>._M_i;
          UNLOCK();
          goto joined_r0x003e1b84;
        }
        goto LAB_003e1cce;
      }
      QHash<long_long,QList<QString>>::tryEmplace_impl<long_long_const&>
                (&local_58,&this->optionValuesHash,&local_60);
      pEVar4 = (local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries;
      bVar2 = (local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].offsets
              [(uint)local_58.iterator.i.bucket & 0x7f];
      puVar12 = pEVar4[bVar2].storage.data + 8;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)puVar12,
                 *(qsizetype *)(pEVar4[bVar2].storage.data + 0x18),argumentIterator->i);
      QList<QString>::end((QList<QString> *)puVar12);
    }
    else {
      QHash<long_long,QList<QString>>::tryEmplace_impl<long_long_const&>
                (&local_58,&this->optionValuesHash,&local_60);
      pEVar4 = (local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].entries;
      bVar2 = (local_58.iterator.i.d)->spans[local_58.iterator.i.bucket >> 7].offsets
              [(uint)local_58.iterator.i.bucket & 0x7f];
      puVar12 = pEVar4[bVar2].storage.data + 8;
      QString::mid((QString *)&local_58,argument,qVar10 + 1,-1);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)puVar12,
                 *(qsizetype *)(pEVar4[bVar2].storage.data + 0x18),(QString *)&local_58);
      QList<QString>::end((QList<QString> *)puVar12);
      if (local_58.iterator.i.d != (Data<QHashPrivate::Node<long_long,_QList<QString>_>_> *)0x0) {
        LOCK();
        ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58.iterator.i.d,2,0x10);
        }
      }
    }
  }
  bVar8 = true;
LAB_003e1c14:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLineParserPrivate::parseOptionValue(const QString &optionName, const QString &argument,
                                                 QStringList::const_iterator *argumentIterator, QStringList::const_iterator argsEnd)
{
    const QLatin1Char assignChar('=');
    const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
    if (nameHashIt != nameHash.constEnd()) {
        const qsizetype assignPos = argument.indexOf(assignChar);
        const NameHash_t::mapped_type optionOffset = *nameHashIt;
        const QCommandLineOption &option = commandLineOptionList.at(optionOffset);
        if (option.flags() & QCommandLineOption::IgnoreOptionsAfter) {
            *argumentIterator = argsEnd;
            return true;
        }
        const bool withValue = !option.valueName().isEmpty();
        if (withValue) {
            if (assignPos == -1) {
                ++(*argumentIterator);
                if (*argumentIterator == argsEnd) {
                    errorText = QCommandLineParser::tr("Missing value after '%1'.").arg(argument);
                    return false;
                }
                optionValuesHash[optionOffset].append(*(*argumentIterator));
            } else {
                optionValuesHash[optionOffset].append(argument.mid(assignPos + 1));
            }
        } else {
            if (assignPos != -1) {
                errorText = QCommandLineParser::tr("Unexpected value after '%1'.").arg(argument.left(assignPos));
                return false;
            }
        }
    }
    return true;
}